

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Backward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar5;
  undefined4 extraout_var_01;
  int iVar6;
  long lVar7;
  int i;
  long lVar8;
  ulong uVar9;
  value_type vVar10;
  Fad<double> sum;
  Fad<double> pivot;
  Fad<double> local_d0;
  FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_> local_b0;
  Fad<double> local_a0;
  undefined1 local_80 [16];
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar5 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar6 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar4)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar6 = 1;
    if (CONCAT44(extraout_var_00,iVar4) != 0 && -1 < extraout_var_00) {
      lVar5 = CONCAT44(extraout_var_00,iVar4);
      do {
        lVar1 = lVar5 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_70,this,lVar1)
        ;
        if (0 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
          lVar7 = 0;
          do {
            local_a0.val_ = 0.0;
            local_a0.dx_.num_elts = 0;
            local_a0.dx_.ptr_to_data = (double *)0x0;
            local_a0.defaultVal = 0.0;
            iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar8 = CONCAT44(extraout_var_01,iVar4);
            while (lVar5 < lVar8) {
              lVar8 = lVar8 + -1;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_d0,this,lVar1,lVar8);
              (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_50,B,lVar8,lVar7);
              local_b0.left_ = (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&local_d0;
              local_b0.right_ = &local_50;
              Fad<double>::operator+=
                        (&local_a0,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_b0);
              Fad<double>::~Fad(&local_50);
              Fad<double>::~Fad(&local_d0);
            }
            (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(&local_50,B,lVar1,lVar7);
            local_80._8_8_ = &local_a0;
            local_b0.left_ = (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)local_80;
            local_b0.right_ = &local_70;
            local_d0.val_ = (local_50.val_ - local_a0.val_) / local_70.val_;
            uVar3 = local_a0.dx_.num_elts;
            if (local_a0.dx_.num_elts < local_50.dx_.num_elts) {
              uVar3 = local_50.dx_.num_elts;
            }
            if ((int)uVar3 <= local_70.dx_.num_elts) {
              uVar3 = local_70.dx_.num_elts;
            }
            local_d0.dx_.num_elts = 0;
            local_d0.dx_.ptr_to_data = (double *)0x0;
            local_80._0_8_ = &local_50;
            if ((int)uVar3 < 1) {
              local_d0.defaultVal = 0.0;
            }
            else {
              local_d0.dx_.num_elts = uVar3;
              local_d0.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar3 * 8);
              local_d0.defaultVal = 0.0;
              if (0 < (int)uVar3) {
                uVar9 = 0;
                do {
                  vVar10 = FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                           ::dx(&local_b0,(int)uVar9);
                  local_d0.dx_.ptr_to_data[uVar9] = vVar10;
                  uVar9 = uVar9 + 1;
                } while (uVar3 != uVar9);
              }
            }
            (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar1,lVar7,&local_d0);
            Fad<double>::~Fad(&local_d0);
            Fad<double>::~Fad(&local_50);
            Fad<double>::~Fad(&local_a0);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
        }
        Fad<double>::~Fad(&local_70);
        bVar2 = 1 < lVar5;
        lVar5 = lVar1;
      } while (bVar2);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}